

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

void errmsg(char *m)

{
  size_t __n;
  ssize_t sVar1;
  ssize_t written;
  size_t s;
  char *m_local;
  
  written = strlen(m);
  s = (size_t)m;
  while( true ) {
    if (written == 0) {
      return;
    }
    __n = strlen((char *)s);
    sVar1 = write(2,(void *)s,__n);
    if (sVar1 < 1) break;
    s = sVar1 + s;
    written = written - sVar1;
  }
  return;
}

Assistant:

static void
errmsg(const char *m)
{
	size_t s = strlen(m);
	ssize_t written;

	while (s > 0) {
		written = write(2, m, strlen(m));
		if (written <= 0)
			return;
		m += written;
		s -= written;
	}
}